

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O2

void __thiscall Planner::Planner(Planner *this,Vec3i World_Size_)

{
  undefined1 local_188 [312];
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  this->_vptr_Planner = (_func_int **)&PTR__Planner_00157388;
  *(undefined8 *)&(this->heuristic).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->heuristic).super__Function_base._M_functor + 8) = 0;
  (this->heuristic).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->heuristic)._M_invoker = (_Invoker_type)0x0;
  (this->direction).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->direction).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->direction).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50[1] = (code *)0x0;
  local_50[0] = Euclidean;
  local_38 = std::_Function_handler<double_(Vec3i,_Vec3i),_double_(*)(Vec3i,_Vec3i)>::_M_invoke;
  local_40 = std::_Function_handler<double_(Vec3i,_Vec3i),_double_(*)(Vec3i,_Vec3i)>::_M_manager;
  Set_Heuristic(this,(function<double_(Vec3i,_Vec3i)> *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  memcpy(local_188,&DAT_00143760,0x138);
  std::vector<Vec3i,std::allocator<Vec3i>>::_M_assign_aux<Vec3i_const*>
            ((vector<Vec3i,std::allocator<Vec3i>> *)&this->direction,local_188,local_50);
  (this->World_Size).x = (int)World_Size_._0_8_;
  (this->World_Size).y = (int)((ulong)World_Size_._0_8_ >> 0x20);
  (this->World_Size).z = World_Size_.z;
  return;
}

Assistant:

Planner::Planner(Vec3i World_Size_) {
  Set_Heuristic(&Planner::Euclidean);  ///< Set default heuristic to Euclidean
  direction = {
    { 0 , 0 , 1}, {0 , 1, 0}, {1, 0, 0}, {0, 0, -1},
    { 0, -1, 0}, {-1, 0, 0}, {0 , 1, 1}, {1, 0, 1},
    { 1, 1, 0}, {0, -1, -1}, {-1, 0, -1}, {-1, -1, 0},
    { 0, 1, -1}, {0, -1, 1}, {1, 0, -1}, {-1, 0, 1},
    { 1, -1, 0}, {-1, 1, 0}, {1, 1, -1}, {1, -1, 1},
    { -1, 1, 1}, {1, -1, -1}, {-1, -1, 1}, {-1, 1, -1},
    { 1, 1, 1}, {-1, -1, -1}
  };
  World_Size = World_Size_;
}